

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_dwt_encode(opj_tcd_t *p_tcd)

{
  opj_tcd_tile_t *poVar1;
  OPJ_BOOL OVar2;
  uint local_34;
  opj_tccp_t *poStack_30;
  OPJ_UINT32 compno;
  opj_tccp_t *l_tccp;
  opj_tcd_tilecomp_t *l_tile_comp;
  opj_tcd_tile_t *l_tile;
  opj_tcd_t *p_tcd_local;
  
  poVar1 = p_tcd->tcd_image->tiles;
  l_tccp = (opj_tccp_t *)p_tcd->tcd_image->tiles->comps;
  poStack_30 = p_tcd->tcp->tccps;
  local_34 = 0;
  do {
    if (poVar1->numcomps <= local_34) {
      return 1;
    }
    if (poStack_30->qmfbid == 1) {
      OVar2 = opj_dwt_encode(p_tcd,(opj_tcd_tilecomp_t *)l_tccp);
      if (OVar2 == 0) {
        return 0;
      }
    }
    else if ((poStack_30->qmfbid == 0) &&
            (OVar2 = opj_dwt_encode_real(p_tcd,(opj_tcd_tilecomp_t *)l_tccp), OVar2 == 0)) {
      return 0;
    }
    l_tccp = (opj_tccp_t *)&l_tccp->stepsizes[10].mant;
    poStack_30 = poStack_30 + 1;
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

static OPJ_BOOL opj_tcd_dwt_encode(opj_tcd_t *p_tcd)
{
    opj_tcd_tile_t * l_tile = p_tcd->tcd_image->tiles;
    opj_tcd_tilecomp_t * l_tile_comp = p_tcd->tcd_image->tiles->comps;
    opj_tccp_t * l_tccp = p_tcd->tcp->tccps;
    OPJ_UINT32 compno;

    for (compno = 0; compno < l_tile->numcomps; ++compno) {
        if (l_tccp->qmfbid == 1) {
            if (! opj_dwt_encode(p_tcd, l_tile_comp)) {
                return OPJ_FALSE;
            }
        } else if (l_tccp->qmfbid == 0) {
            if (! opj_dwt_encode_real(p_tcd, l_tile_comp)) {
                return OPJ_FALSE;
            }
        }

        ++l_tile_comp;
        ++l_tccp;
    }

    return OPJ_TRUE;
}